

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O2

int nn_rep_events(nn_sockbase *self)

{
  uint uVar1;
  
  uVar1 = nn_xrep_events(self);
  if (((ulong)self[0x1b].vfptr & 1) == 0) {
    uVar1 = uVar1 & 0xfffffffd;
  }
  return uVar1;
}

Assistant:

int nn_rep_events (struct nn_sockbase *self)
{
    struct nn_rep *rep;
    int events;

    rep = nn_cont (self, struct nn_rep, xrep.sockbase);
    events = nn_xrep_events (&rep->xrep.sockbase);
    if (!(rep->flags & NN_REP_INPROGRESS))
        events &= ~NN_SOCKBASE_EVENT_OUT;
    return events;
}